

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

bool __thiscall Parser::IsCurBlockInLoop(Parser *this)

{
  OpCode OVar1;
  uint uVar2;
  StmtNest *pSStack_20;
  OpCode nop;
  StmtNest *stmt;
  Parser *this_local;
  
  pSStack_20 = this->m_pstmtCur;
  while( true ) {
    if (pSStack_20 == (StmtNest *)0x0) {
      return false;
    }
    OVar1 = StmtNest::GetNop(pSStack_20);
    uVar2 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar2 & 0x80) != 0) break;
    if (OVar1 == knopFncDecl) {
      return false;
    }
    pSStack_20 = pSStack_20->pstmtOuter;
  }
  return true;
}

Assistant:

bool Parser::IsCurBlockInLoop() const
{
    for (StmtNest *stmt = this->m_pstmtCur; stmt != nullptr; stmt = stmt->pstmtOuter)
    {
        OpCode nop = stmt->GetNop();
        if (ParseNode::Grfnop(nop) & fnopContinue)
        {
            return true;
        }
        if (nop == knopFncDecl)
        {
            return false;
        }
    }
    return false;
}